

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_unix_util.c
# Opt level: O0

PaError PaUnixThread_PrepareNotify(PaUnixThread *self)

{
  PaError local_14;
  PaError result;
  PaUnixThread *self_local;
  
  local_14 = 0;
  if (self->parentWaiting == 0) {
    PaUtil_DebugPrint(
                     "Expression \'self->parentWaiting\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/os/unix/pa_unix_util.c\', line: 467\n"
                     );
    local_14 = -0x2702;
  }
  else {
    paUtilErr_ = PaUnixMutex_Lock(&self->mtx);
    if (paUtilErr_ < 0) {
      PaUtil_DebugPrint(
                       "Expression \'PaUnixMutex_Lock( &self->mtx )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/os/unix/pa_unix_util.c\', line: 469\n"
                       );
      local_14 = paUtilErr_;
    }
    else {
      self->locked = 1;
    }
  }
  return local_14;
}

Assistant:

PaError PaUnixThread_PrepareNotify( PaUnixThread* self )
{
    PaError result = paNoError;
    PA_UNLESS( self->parentWaiting, paInternalError );

    PA_ENSURE( PaUnixMutex_Lock( &self->mtx ) );
    self->locked = 1;

error:
    return result;
}